

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTime.h
# Opt level: O2

void mSleep(long Milliseconds)

{
  timespec req;
  timespec local_10;
  
  local_10.tv_sec = Milliseconds / 1000;
  local_10.tv_nsec = (Milliseconds % 1000) * 1000000;
  nanosleep(&local_10,(timespec *)0x0);
  return;
}

Assistant:

inline void mSleep(long Milliseconds)
{
#ifdef _WIN32
	Sleep(Milliseconds);
#else 
	// usleep() is considered as obsolete.
	//usleep(Milliseconds*1000);
	struct timespec req;

	req.tv_sec = Milliseconds/1000; // Seconds.
	req.tv_nsec = (Milliseconds%1000)*1000000; // Additional nanoseconds.
	nanosleep(&req, NULL);
#endif // _WIN32
}